

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetLite
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32_t tag;
  byte unaff_BPL;
  uint32_t first_byte_or_zero;
  
  do {
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      tag = (uint32_t)bVar1;
      first_byte_or_zero = (uint32_t)bVar1;
      if ((char)bVar1 < '\0') goto LAB_003af2db;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_003af2db:
      tag = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    input->last_tag_ = tag;
    if (tag == 0) {
      unaff_BPL = 1;
LAB_003af322:
      bVar3 = false;
    }
    else {
      if (tag == 0xb) {
        bVar3 = ParseMessageSetItemLite(this,input,extension_finder,field_skipper);
      }
      else {
        bVar3 = ParseField(this,tag,input,extension_finder,field_skipper);
      }
      if (bVar3 == false) {
        unaff_BPL = 0;
        goto LAB_003af322;
      }
      bVar3 = true;
    }
    if (!bVar3) {
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool ExtensionSet::ParseMessageSetLite(io::CodedInputStream* input,
                                       ExtensionFinder* extension_finder,
                                       FieldSkipper* field_skipper) {
  while (true) {
    const uint32_t tag = input->ReadTag();
    switch (tag) {
      case 0:
        return true;
      case WireFormatLite::kMessageSetItemStartTag:
        if (!ParseMessageSetItemLite(input, extension_finder, field_skipper)) {
          return false;
        }
        break;
      default:
        if (!ParseField(tag, input, extension_finder, field_skipper)) {
          return false;
        }
        break;
    }
  }
}